

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O2

void __thiscall Fl_Window::free_icons(Fl_Window *this)

{
  void *pvVar1;
  long *plVar2;
  icon_data *piVar3;
  long lVar4;
  
  piVar3 = this->icon_;
  *(undefined8 *)piVar3 = 0;
  if (*(long *)(piVar3 + 8) != 0) {
    lVar4 = 0;
    while( true ) {
      pvVar1 = *(void **)(piVar3 + 8);
      if (*(int *)(piVar3 + 0x10) <= lVar4) break;
      plVar2 = *(long **)((long)pvVar1 + lVar4 * 8);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
        piVar3 = this->icon_;
      }
      lVar4 = lVar4 + 1;
    }
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
      piVar3 = this->icon_;
    }
    *(undefined8 *)(piVar3 + 8) = 0;
  }
  *(undefined4 *)(piVar3 + 0x10) = 0;
  return;
}

Assistant:

void Fl_Window::free_icons() {
  int i;

  icon_->legacy_icon = 0L;

  if (icon_->icons) {
    for (i = 0;i < icon_->count;i++)
      delete icon_->icons[i];
    delete [] icon_->icons;
    icon_->icons = 0L;
  }

  icon_->count = 0;

#ifdef WIN32
  if (icon_->big_icon)
    DestroyIcon(icon_->big_icon);
  if (icon_->small_icon)
    DestroyIcon(icon_->small_icon);

  icon_->big_icon = NULL;
  icon_->small_icon = NULL;
#endif
}